

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

int init(EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  upb_Arena *in_RDX;
  byte in_SIL;
  size_t size;
  
  if (0x1f < in_SIL) {
    return 0;
  }
  *(undefined4 *)(ctx + 8) = 0;
  uVar1 = -1 << (in_SIL & 0x1f);
  *(uint *)(ctx + 0xc) = ~uVar1;
  size = (ulong)-uVar1 * 0x18;
  pvVar3 = upb_Arena_Malloc(in_RDX,size);
  *(void **)ctx = pvVar3;
  if (pvVar3 == (void *)0x0) {
    iVar2 = 0;
  }
  else {
    pvVar3 = memset(pvVar3,0,size);
    iVar2 = (int)CONCAT71((int7)((ulong)pvVar3 >> 8),1);
  }
  return iVar2;
}

Assistant:

static bool init(upb_table* t, uint8_t size_lg2, upb_Arena* a) {
  if (size_lg2 >= 32) {
    return false;
  }
  t->count = 0;
  uint32_t size = 1 << size_lg2;
  t->mask = size - 1;  // 0 mask if size_lg2 is 0
  if (upb_table_size(t) > (SIZE_MAX / sizeof(upb_tabent))) {
    return false;
  }
  size_t bytes = upb_table_size(t) * sizeof(upb_tabent);
  if (bytes > 0) {
    t->entries = upb_Arena_Malloc(a, bytes);
    if (!t->entries) return false;
    memset(t->entries, 0, bytes);
  } else {
    t->entries = NULL;
  }
  return true;
}